

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::InitializeUpdateValidity
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,SelectionVector *sel)

{
  uint uVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = (ulong)update_info->N;
  pvVar6 = (void *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  puVar2 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (uVar5 != 0) {
      switchD_005681f0::default(pvVar6,1,uVar5);
    }
  }
  else if (uVar5 != 0) {
    psVar3 = sel->sel_vector;
    psVar4 = update->sel->sel_vector;
    uVar7 = 0;
    do {
      uVar8 = uVar7;
      if (psVar3 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar3[uVar7];
      }
      if (psVar4 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar4[uVar8];
      }
      *(bool *)((long)pvVar6 + uVar7) = (puVar2[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0;
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  FlatVector::VerifyFlatVector(base_data);
  uVar5 = (ulong)base_info->N;
  pvVar6 = (void *)((long)&base_info[1].segment + (ulong)base_info->max * 4);
  puVar2 = (base_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (uVar5 != 0) {
      switchD_005681f0::default(pvVar6,1,uVar5);
      return;
    }
  }
  else if (uVar5 != 0) {
    uVar7 = 0;
    do {
      uVar1 = *(uint *)((long)&base_info[1].segment + uVar7 * 4);
      *(bool *)((long)pvVar6 + uVar7) = (puVar2[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0;
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  return;
}

Assistant:

static void InitializeUpdateValidity(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                                     UnifiedVectorFormat &update, const SelectionVector &sel) {
	auto &update_mask = update.validity;
	auto tuple_data = update_info.GetData<bool>();

	if (!update_mask.AllValid()) {
		for (idx_t i = 0; i < update_info.N; i++) {
			auto idx = update.sel->get_index(sel.get_index(i));
			tuple_data[i] = update_mask.RowIsValidUnsafe(idx);
		}
	} else {
		for (idx_t i = 0; i < update_info.N; i++) {
			tuple_data[i] = true;
		}
	}

	auto &base_mask = FlatVector::Validity(base_data);
	auto base_tuple_data = base_info.GetData<bool>();
	auto base_tuples = base_info.GetTuples();
	if (!base_mask.AllValid()) {
		for (idx_t i = 0; i < base_info.N; i++) {
			base_tuple_data[i] = base_mask.RowIsValidUnsafe(base_tuples[i]);
		}
	} else {
		for (idx_t i = 0; i < base_info.N; i++) {
			base_tuple_data[i] = true;
		}
	}
}